

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O2

ForStatement * __thiscall ninx::parser::element::ForStatement::clone_impl(ForStatement *this)

{
  ForStatement *this_00;
  __uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_20;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_18;
  
  this_00 = (ForStatement *)operator_new(0x48);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_18);
  ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&local_20);
  ForStatement(this_00,&this->iterator_name,
               (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)&local_18,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_20);
  if ((_Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
        .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl != (Block *)0x0)
  {
    (**(code **)(*(_func_int **)
                  local_20._M_t.
                  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl + 8))()
    ;
  }
  local_20._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
       (tuple<ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>)
       (_Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
        )0x0;
  if ((Block *)local_18._M_head_impl != (Block *)0x0) {
    (*((ASTElement *)&((local_18._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement)
      ->_vptr_ASTElement[1])();
  }
  return this_00;
}

Assistant:

ninx::parser::element::ForStatement *ninx::parser::element::ForStatement::clone_impl() {
    return new ForStatement(this->iterator_name, this->range_expr->clone<Expression>(), this->body->clone<Block>());
}